

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonehash.cpp
# Opt level: O2

int __thiscall asmjit::v1_14::ZoneHashBase::_remove(ZoneHashBase *this,char *__filename)

{
  long *plVar1;
  long in_RDX;
  long *plVar2;
  
  plVar1 = (long *)((ulong)(*(uint *)(in_RDX + 8) -
                           (int)((ulong)*(uint *)(this + 0x18) * (ulong)*(uint *)(in_RDX + 8) >>
                                ((byte)this[0x1c] & 0x3f)) * *(int *)(this + 0x10)) * 8 +
                   *(long *)this);
  do {
    plVar2 = plVar1;
    plVar1 = (long *)*plVar2;
    if (plVar1 == (long *)0x0) {
      return 0;
    }
  } while (plVar1 != (long *)in_RDX);
  *plVar2 = *plVar1;
  *(long *)(this + 8) = *(long *)(this + 8) + -1;
  return (int)in_RDX;
}

Assistant:

ZoneHashNode* ZoneHashBase::_remove(ZoneAllocator* allocator, ZoneHashNode* node) noexcept {
  DebugUtils::unused(allocator);
  uint32_t hashMod = _calcMod(node->_hashCode);

  ZoneHashNode** pPrev = &_data[hashMod];
  ZoneHashNode* p = *pPrev;

  while (p) {
    if (p == node) {
      *pPrev = p->_hashNext;
      _size--;
      return node;
    }

    pPrev = &p->_hashNext;
    p = *pPrev;
  }

  return nullptr;
}